

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

void exp2reg(FuncState *fs,expdesc *e,int reg)

{
  int vtarget;
  int iVar1;
  int iVar2;
  int local_34;
  
  discharge2reg(fs,e,reg);
  if (e->k == VJMP) {
    luaK_concat(fs,&e->t,(e->u).info);
  }
  iVar2 = e->f;
  if (e->t == iVar2) goto LAB_001274f5;
  iVar1 = need_value(fs,e->t);
  if (iVar1 == 0) {
    iVar1 = need_value(fs,iVar2);
    if (iVar1 != 0) goto LAB_00127453;
    local_34 = -1;
    iVar1 = -1;
  }
  else {
LAB_00127453:
    iVar2 = -1;
    if (e->k != VJMP) {
      iVar2 = luaK_jump(fs);
    }
    fs->lasttarget = fs->pc;
    iVar1 = luaK_code(fs,reg << 6 | 0x4003);
    fs->lasttarget = fs->pc;
    local_34 = luaK_code(fs,reg << 6 | 0x800003);
    fs->lasttarget = fs->pc;
    luaK_concat(fs,&fs->jpc,iVar2);
    iVar2 = e->f;
  }
  vtarget = fs->pc;
  fs->lasttarget = vtarget;
  patchlistaux(fs,iVar2,vtarget,reg,iVar1);
  patchlistaux(fs,e->t,vtarget,reg,local_34);
LAB_001274f5:
  e->t = -1;
  e->f = -1;
  (e->u).info = reg;
  e->k = VNONRELOC;
  return;
}

Assistant:

static void exp2reg (FuncState *fs, expdesc *e, int reg) {
  discharge2reg(fs, e, reg);
  if (e->k == VJMP)  /* expression itself is a test? */
    luaK_concat(fs, &e->t, e->u.info);  /* put this jump in 't' list */
  if (hasjumps(e)) {
    int final;  /* position after whole expression */
    int p_f = NO_JUMP;  /* position of an eventual LOAD false */
    int p_t = NO_JUMP;  /* position of an eventual LOAD true */
    if (need_value(fs, e->t) || need_value(fs, e->f)) {
      int fj = (e->k == VJMP) ? NO_JUMP : luaK_jump(fs);
      p_f = code_loadbool(fs, reg, 0, 1);
      p_t = code_loadbool(fs, reg, 1, 0);
      luaK_patchtohere(fs, fj);
    }
    final = luaK_getlabel(fs);
    patchlistaux(fs, e->f, final, reg, p_f);
    patchlistaux(fs, e->t, final, reg, p_t);
  }
  e->f = e->t = NO_JUMP;
  e->u.info = reg;
  e->k = VNONRELOC;
}